

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::~XmlSerializer(XmlSerializer *this)

{
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~_Rb_tree(&(this->mMatId2MatArray)._M_t);
  std::_Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~_Vector_base
            (&(this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>);
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&(this->mMeshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::
  vector<Assimp::D3MF::XmlSerializer::MetaEntry,_std::allocator<Assimp::D3MF::XmlSerializer::MetaEntry>_>
  ::~vector(&this->mMetaData);
  return;
}

Assistant:

~XmlSerializer() {
        // empty
    }